

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

Symbol * slang::ast::Lookup::selectChild
                   (Symbol *initialSymbol,
                   span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>
                   selectors,ASTContext *context,LookupResult *result)

{
  ElementSelectSyntax *pEVar1;
  SourceRange range;
  SourceRange sourceRange;
  string_view arg;
  bool bVar2;
  reference ppEVar3;
  Symbol *pSVar4;
  SourceLocation SVar5;
  SourceLocation in_RDI;
  LookupResult *in_R8;
  SourceRange SVar6;
  LookupResult *in_stack_00000020;
  ASTContext *in_stack_00000028;
  BitSelectSyntax *in_stack_00000030;
  Symbol *in_stack_00000038;
  anon_class_24_3_3cd28926 selectorError;
  LookupResult *in_stack_00000090;
  ASTContext *in_stack_00000098;
  RangeSelectSyntax *in_stack_000000a0;
  InstanceArraySymbol *in_stack_000000a8;
  Diagnostic *diag;
  ElementSelectSyntax *syntax;
  iterator __end2;
  iterator __begin2;
  span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> *__range2;
  SyntaxNode *prevRangeSelect;
  Symbol *symbol;
  span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>
  *in_stack_fffffffffffffed8;
  InstanceArraySymbol *in_stack_fffffffffffffee0;
  SourceLocation in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  DiagCode in_stack_fffffffffffffef4;
  LookupResult *in_stack_fffffffffffffef8;
  SourceLocation in_stack_ffffffffffffff00;
  SourceLocation in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  DiagCode DVar7;
  Diagnostic *in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  SyntaxNode *in_stack_ffffffffffffff30;
  SourceLocation this;
  __normal_iterator<const_slang::syntax::ElementSelectSyntax_*const_*,_std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
  local_50;
  undefined1 *local_48;
  ElementSelectSyntax *local_40;
  SourceLocation local_38;
  LookupResult *local_30;
  undefined1 local_18 [24];
  
  local_40 = (ElementSelectSyntax *)0x0;
  local_48 = local_18;
  local_38 = in_RDI;
  local_30 = in_R8;
  local_50._M_current =
       (ElementSelectSyntax **)
       std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>::begin
                 (in_stack_fffffffffffffed8);
  std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>::end
            ((span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> *)
             in_stack_fffffffffffffee8);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_slang::syntax::ElementSelectSyntax_*const_*,_std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::syntax::ElementSelectSyntax_*const_*,_std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffee0,
                       (__normal_iterator<const_slang::syntax::ElementSelectSyntax_*const_*,_std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffed8);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return (Symbol *)local_38;
    }
    ppEVar3 = __gnu_cxx::
              __normal_iterator<const_slang::syntax::ElementSelectSyntax_*const_*,_std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
              ::operator*(&local_50);
    DVar7 = SUB84((ulong)in_stack_ffffffffffffff10 >> 0x20,0);
    pEVar1 = *ppEVar3;
    if ((*(int *)local_38 != 0x31) && (*(int *)local_38 != 0x38)) {
      not_null<const_slang::ast::Scope_*>::operator*
                ((not_null<const_slang::ast::Scope_*> *)0x1296419);
      DVar7 = SUB84((ulong)local_30 >> 0x20,0);
      slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff30);
      SVar6.endLoc = in_stack_ffffffffffffff08;
      SVar6.startLoc = in_stack_ffffffffffffff00;
      LookupResult::addDiag
                (in_stack_fffffffffffffef8,
                 (Scope *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),DVar7,SVar6)
      ;
      arg._M_str = (char *)in_stack_ffffffffffffff30;
      arg._M_len = in_stack_ffffffffffffff28;
      Diagnostic::operator<<(in_stack_ffffffffffffff20,arg);
      Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffffee0,in_stack_fffffffffffffef4,
                          in_stack_fffffffffffffee8);
      return (Symbol *)0x0;
    }
    if (pEVar1->selector == (SelectorSyntax *)0x0) {
      pSVar4 = selectChild::anon_class_24_3_3cd28926::operator()
                         ((anon_class_24_3_3cd28926 *)in_stack_ffffffffffffff00);
      return pSVar4;
    }
    if (local_40 != (ElementSelectSyntax *)0x0) break;
    in_stack_fffffffffffffef4 = *(DiagCode *)pEVar1->selector;
    if ((in_stack_fffffffffffffef4 == (DiagCode)0x1c) ||
       (in_stack_fffffffffffffef4 != (DiagCode)0x35)) {
      local_40 = pEVar1;
      if (*(int *)local_38 != 0x31) {
        pSVar4 = selectChild::anon_class_24_3_3cd28926::operator()
                           ((anon_class_24_3_3cd28926 *)in_stack_ffffffffffffff00);
        return pSVar4;
      }
      in_stack_fffffffffffffee0 = Symbol::as<slang::ast::InstanceArraySymbol>((Symbol *)0x12966da);
      slang::syntax::SyntaxNode::as<slang::syntax::RangeSelectSyntax>
                (&pEVar1->selector->super_SyntaxNode);
      local_38 = (SourceLocation)
                 selectChildRange(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
                                  in_stack_00000090);
      if (local_38 == (SourceLocation)0x0) {
        return (Symbol *)0x0;
      }
    }
    else {
      in_stack_fffffffffffffee8 = local_38;
      slang::syntax::SyntaxNode::as<slang::syntax::BitSelectSyntax>
                (&pEVar1->selector->super_SyntaxNode);
      local_38 = (SourceLocation)
                 selectSingleChild(in_stack_00000038,in_stack_00000030,in_stack_00000028,
                                   in_stack_00000020);
      if (local_38 == (SourceLocation)0x0) {
        return (Symbol *)0x0;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_slang::syntax::ElementSelectSyntax_*const_*,_std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
    ::operator++(&local_50);
  }
  SVar5 = (SourceLocation)
          not_null<const_slang::ast::Scope_*>::operator*
                    ((not_null<const_slang::ast::Scope_*> *)0x129657a);
  SVar6 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff30);
  this = SVar6.startLoc;
  sourceRange.endLoc = in_stack_ffffffffffffff08;
  sourceRange.startLoc = SVar5;
  LookupResult::addDiag
            (local_30,(Scope *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),DVar7,
             sourceRange);
  slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this);
  range.endLoc._0_4_ = in_stack_fffffffffffffef0;
  range.startLoc = in_stack_fffffffffffffee8;
  range.endLoc._4_2_ = in_stack_fffffffffffffef4.subsystem;
  range.endLoc._6_2_ = in_stack_fffffffffffffef4.code;
  Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffee0,range);
  return (Symbol *)0x0;
}

Assistant:

const Symbol* Lookup::selectChild(const Symbol& initialSymbol,
                                  std::span<const ElementSelectSyntax* const> selectors,
                                  const ASTContext& context, LookupResult& result) {
    const Symbol* symbol = &initialSymbol;
    const SyntaxNode* prevRangeSelect = nullptr;
    for (const ElementSelectSyntax* syntax : selectors) {
        if (symbol->kind != SymbolKind::InstanceArray &&
            symbol->kind != SymbolKind::GenerateBlockArray) {
            // I think it's safe to assume that the symbol name here will not be empty
            // because if it was, it'd be an instance array or generate array.
            auto& diag = result.addDiag(*context.scope, diag::ScopeNotIndexable,
                                        syntax->sourceRange());
            diag << symbol->name;
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            return nullptr;
        }

        auto selectorError = [&]() -> const Symbol* {
            result.addDiag(*context.scope, diag::InvalidScopeIndexExpression,
                           syntax->sourceRange());
            return nullptr;
        };

        if (!syntax->selector)
            return selectorError();

        if (prevRangeSelect) {
            result.addDiag(*context.scope, diag::SelectAfterRangeSelect, syntax->sourceRange())
                << prevRangeSelect->sourceRange();
            return nullptr;
        }

        switch (syntax->selector->kind) {
            case SyntaxKind::BitSelect:
                symbol = selectSingleChild(*symbol, syntax->selector->as<BitSelectSyntax>(),
                                           context, result);
                if (!symbol)
                    return nullptr;
                break;
            case SyntaxKind::SimpleRangeSelect:
            case SyntaxKind::AscendingRangeSelect:
            case SyntaxKind::DescendingRangeSelect:
                prevRangeSelect = syntax;
                if (symbol->kind != SymbolKind::InstanceArray)
                    return selectorError();

                symbol = selectChildRange(symbol->as<InstanceArraySymbol>(),
                                          syntax->selector->as<RangeSelectSyntax>(), context,
                                          result);
                if (!symbol)
                    return nullptr;
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    return symbol;
}